

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

bool __thiscall ImFontAtlas::Build(ImFontAtlas *this)

{
  undefined2 uVar1;
  undefined4 uVar2;
  undefined2 uVar5;
  undefined2 uVar6;
  undefined2 uVar8;
  stbtt__point sVar3;
  stbtt__point sVar4;
  undefined4 uVar7;
  stbtt_uint8 sVar9;
  byte bVar10;
  byte bVar11;
  undefined4 uVar12;
  undefined1 uVar17;
  ImFontAtlas *pIVar13;
  ImFont *pIVar14;
  stbtt_uint8 *data;
  undefined6 uVar18;
  undefined4 uVar19;
  stbtt__active_edge *psVar15;
  undefined8 *puVar16;
  stbrp_node *psVar20;
  short sVar21;
  short sVar22;
  undefined1 auVar23 [15];
  undefined1 auVar24 [14];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined4 uVar32;
  undefined4 uVar33;
  undefined1 auVar34 [15];
  unkuint9 Var35;
  undefined1 auVar36 [15];
  undefined1 auVar37 [13];
  undefined1 auVar38 [14];
  undefined1 auVar39 [12];
  undefined1 auVar40 [15];
  unkbyte10 Var41;
  uint6 uVar42;
  undefined8 this_00;
  int iVar51;
  int iVar52;
  uint uVar53;
  bool bVar43;
  stbtt_uint32 sVar44;
  stbtt_uint32 sVar45;
  stbtt_uint32 sVar46;
  stbtt_uint32 sVar47;
  stbtt_uint32 sVar48;
  stbtt_uint32 sVar49;
  stbtt_uint32 sVar50;
  ImFontBuildSrcData *pIVar54;
  ImFontConfig *pIVar55;
  ImFont **ppIVar56;
  long lVar57;
  ImFontBuildDstData *pIVar58;
  stbrp_rect *psVar59;
  stbtt_packedchar *psVar60;
  int *piVar61;
  stbrp_context *ptr;
  uchar *puVar62;
  stbtt__edge *psVar63;
  stbtt__buf *scanline;
  undefined8 *puVar64;
  stbtt__active_edge *psVar65;
  long *plVar66;
  ushort uVar67;
  ushort uVar68;
  uint uVar69;
  ulong uVar70;
  stbtt__active_edge *psVar71;
  stbtt__buf *psVar72;
  long lVar73;
  ImWchar *pIVar74;
  float fVar75;
  ushort *puVar76;
  uint *puVar77;
  stbtt__active_edge *psVar78;
  byte *pbVar79;
  ImVector<ImFontConfig> *pIVar80;
  int iVar81;
  uint uVar82;
  int iVar83;
  stbrp_rect *psVar84;
  stbtt__edge *psVar85;
  ulong uVar86;
  ulong uVar87;
  uchar *puVar88;
  uint uVar93;
  ulong uVar89;
  byte *pbVar90;
  int iVar91;
  ImBitVector *this_01;
  stbtt__point *ptr_00;
  ImFontAtlas *pIVar92;
  ulong uVar94;
  long lVar95;
  uchar *puVar96;
  bool bVar97;
  float fVar98;
  float fVar99;
  char cVar102;
  char cVar103;
  undefined4 extraout_XMM0_Db;
  undefined4 uVar104;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined1 extraout_var [12];
  undefined4 uVar105;
  undefined4 uVar106;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  float fVar109;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  float fVar112;
  float fVar113;
  undefined1 in_XMM3 [16];
  undefined1 auVar114 [16];
  float fVar115;
  float fVar116;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  float fVar119;
  float fVar120;
  stbtt__buf sVar121;
  int iStack_498;
  stbtt_uint32 sStack_494;
  ulong uStack_490;
  undefined1 auStack_488 [16];
  ImFontAtlas *pIStack_478;
  float fStack_46c;
  ImVector<ImFontBuildSrcData> IStack_468;
  void *pvStack_450;
  undefined1 auStack_448 [16];
  stbrp_node *psStack_430;
  stbtt__edge *psStack_428;
  stbtt__point *psStack_420;
  undefined8 uStack_418;
  float fStack_40c;
  ulong uStack_408;
  float *pfStack_400;
  int iStack_3f8;
  int iStack_3f4;
  int iStack_3f0;
  float fStack_3ec;
  ImVector<stbrp_rect> IStack_3e8;
  ImVector<ImFontBuildDstData> IStack_3d8;
  stbrp_rect *psStack_3c8;
  undefined8 *puStack_3c0;
  ImVector<stbtt_packedchar> IStack_3b8;
  undefined1 auStack_3a8 [16];
  uchar *puStack_398;
  ImFontBuildSrcData *pIStack_390;
  ulong uStack_388;
  uchar *puStack_380;
  int iStack_374;
  uint uStack_370;
  uint uStack_36c;
  int iStack_368;
  float fStack_364;
  float fStack_360;
  int iStack_35c;
  int iStack_358;
  uint uStack_354;
  stbrp_context *psStack_350;
  ulong uStack_348;
  long lStack_340;
  long lStack_338;
  stbtt__edge *psStack_330;
  ulong uStack_328;
  ulong uStack_320;
  undefined1 auStack_318 [16];
  ImFontConfig *pIStack_300;
  ulong uStack_2f8;
  uchar *puStack_2f0;
  stbrp_rect *psStack_2e8;
  long lStack_2e0;
  long lStack_2d8;
  size_t sStack_2d0;
  size_t sStack_2c8;
  stbtt_packedchar *psStack_2c0;
  ulong uStack_2b8;
  int iStack_2b0;
  int iStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  undefined1 auStack_298 [16];
  undefined1 auStack_288 [16];
  undefined1 auStack_278 [16];
  undefined1 auStack_268 [16];
  undefined1 auStack_258 [16];
  float fStack_248;
  undefined4 uStack_244;
  undefined4 uStack_240;
  undefined4 uStack_23c;
  stbtt__buf asStack_238 [32];
  
  if (this->Locked == true) {
    __assert_fail("!Locked && \"Cannot modify a locked ImFontAtlas between NewFrame() and EndFrame/Render()!\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_draw.cpp"
                  ,0x8c8,"bool ImFontAtlas::Build()");
  }
  if (this->FontBuilderIO != (ImFontBuilderIO *)0x0) {
    bVar43 = (*this->FontBuilderIO->FontBuilder_Build)(this);
    return bVar43;
  }
  ImFontAtlasGetBuilderForStbTruetype::io.FontBuilder_Build = ImFontAtlasBuildWithStbTruetype;
  if ((this->ConfigData).Size < 1) {
    __assert_fail("atlas->ConfigData.Size > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_draw.cpp"
                  ,0x918,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
  }
  ImFontAtlasBuildInit(this);
  this->TexID = (ImTextureID)0x0;
  this->TexWidth = 0;
  this->TexHeight = 0;
  (this->TexUvScale).x = 0.0;
  (this->TexUvScale).y = 0.0;
  (this->TexUvWhitePixel).x = 0.0;
  (this->TexUvWhitePixel).y = 0.0;
  ClearTexData(this);
  IStack_468.Size = 0;
  IStack_468.Capacity = 0;
  IStack_468.Data = (ImFontBuildSrcData *)0x0;
  IStack_3d8.Size = 0;
  IStack_3d8.Capacity = 0;
  IStack_3d8.Data = (ImFontBuildDstData *)0x0;
  ImVector<ImFontBuildSrcData>::resize(&IStack_468,(this->ConfigData).Size);
  ImVector<ImFontBuildDstData>::resize(&IStack_3d8,(this->Fonts).Size);
  auStack_488._8_8_ = &this->ConfigData;
  memset(IStack_468.Data,0,(long)IStack_468.Size * 0x110);
  memset(IStack_3d8.Data,0,(long)IStack_3d8.Size << 5);
  iVar51 = 0;
  pIStack_478 = this;
  while (pIVar92 = pIStack_478, this_00 = auStack_488._8_8_, iStack_374 = *(int *)auStack_488._8_8_,
        iStack_3f8 = iVar51, iVar51 < iStack_374) {
    pIVar54 = ImVector<ImFontBuildSrcData>::operator[](&IStack_468,iVar51);
    pIVar55 = ImVector<ImFontConfig>::operator[]((ImVector<ImFontConfig> *)this_00,iVar51);
    if ((pIVar55->DstFont == (ImFont *)0x0) ||
       (pIVar13 = pIVar55->DstFont->ContainerAtlas,
       pIVar13 != pIVar92 && pIVar13 != (ImFontAtlas *)0x0)) {
      __assert_fail("cfg.DstFont && (!cfg.DstFont->IsLoaded() || cfg.DstFont->ContainerAtlas == atlas)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_draw.cpp"
                    ,0x930,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
    }
    pIVar54->DstIndex = -1;
    iVar81 = 0;
    iVar51 = -1;
    while ((iVar81 < (this->Fonts).Size && (iVar51 == -1))) {
      pIVar14 = pIVar55->DstFont;
      ppIVar56 = ImVector<ImFont_*>::operator[](&this->Fonts,iVar81);
      if (pIVar14 == *ppIVar56) {
        pIVar54->DstIndex = iVar81;
        iVar51 = iVar81;
      }
      else {
        iVar51 = pIVar54->DstIndex;
      }
      iVar81 = iVar81 + 1;
    }
    if (iVar51 == -1) {
      __assert_fail("src_tmp.DstIndex != -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_draw.cpp"
                    ,0x939,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
    }
    data = (stbtt_uint8 *)pIVar55->FontData;
    iVar51 = pIVar55->FontNo;
    sVar9 = *data;
    if (sVar9 == '\0') {
      if (data[1] != '\x01') goto LAB_001556d6;
LAB_001551b7:
      if ((data[2] != '\0') || (data[3] != '\0')) goto LAB_001556d6;
LAB_001551cf:
      sVar50 = -(uint)(iVar51 != 0);
    }
    else {
      if (sVar9 != 't') {
        if (sVar9 != 'O') {
          if ((sVar9 != '1') || (data[1] != '\0')) goto LAB_001556d6;
          goto LAB_001551b7;
        }
        if (((data[1] != 'T') || (data[2] != 'T')) || (data[3] != 'O')) goto LAB_001556d6;
        goto LAB_001551cf;
      }
      sVar9 = data[1];
      if (sVar9 == 'r') {
        if ((data[2] != 'u') || (data[3] != 'e')) goto LAB_001556d6;
        goto LAB_001551cf;
      }
      if (sVar9 != 't') {
        if (((sVar9 != 'y') || (data[2] != 'p')) || (data[3] != '1')) goto LAB_001556d6;
        goto LAB_001551cf;
      }
      if (((data[2] != 'c') || (data[3] != 'f')) ||
         (((sVar50 = ttULONG(data + 4), sVar50 != 0x20000 && (sVar50 != 0x10000)) ||
          (uVar82 = *(uint *)(data + 8),
          (int)(uVar82 >> 0x18 | (uVar82 & 0xff0000) >> 8 | (uVar82 & 0xff00) << 8 | uVar82 << 0x18)
          <= iVar51)))) goto LAB_001556d6;
      sVar50 = ttULONG(data + (long)iVar51 * 4 + 0xc);
    }
    if ((int)sVar50 < 0) {
LAB_001556d6:
      __assert_fail("font_offset >= 0 && \"FontData is incorrect, or FontNo cannot be found.\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_draw.cpp"
                    ,0x93e,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
    }
    (pIVar54->FontInfo).data = data;
    (pIVar54->FontInfo).fontstart = sVar50;
    (pIVar54->FontInfo).cff.data = (uchar *)0x0;
    (pIVar54->FontInfo).cff.cursor = 0;
    (pIVar54->FontInfo).cff.size = 0;
    sVar44 = stbtt__find_table(data,sVar50,"cmap");
    sVar45 = stbtt__find_table(data,sVar50,"loca");
    uStack_490 = CONCAT44(uStack_490._4_4_,sVar45);
    (pIVar54->FontInfo).loca = sVar45;
    sVar45 = stbtt__find_table(data,sVar50,"head");
    (pIVar54->FontInfo).head = sVar45;
    sVar46 = stbtt__find_table(data,sVar50,"glyf");
    (pIVar54->FontInfo).glyf = sVar46;
    sVar47 = stbtt__find_table(data,sVar50,"hhea");
    (pIVar54->FontInfo).hhea = sVar47;
    sVar48 = stbtt__find_table(data,sVar50,"hmtx");
    (pIVar54->FontInfo).hmtx = sVar48;
    sVar49 = stbtt__find_table(data,sVar50,"kern");
    (pIVar54->FontInfo).kern = sVar49;
    auStack_448._0_4_ = sVar50;
    sVar50 = stbtt__find_table(data,sVar50,"GPOS");
    (pIVar54->FontInfo).gpos = sVar50;
    if ((((sVar44 == 0) || (sVar45 == 0)) || (sVar47 == 0)) || (sVar48 == 0)) goto LAB_00157965;
    if (sVar46 == 0) {
      auStack_488._0_8_ = auStack_488._0_8_ & 0xffffffff00000000;
      uStack_418._0_4_ = 0;
      IStack_3b8.Size = 2;
      sStack_494 = 0;
      sVar50 = stbtt__find_table(data,auStack_448._0_4_,"CFF ");
      if (sVar50 == 0) goto LAB_00157965;
      (pIVar54->FontInfo).fdselect.data = (uchar *)0x0;
      (pIVar54->FontInfo).fdselect.cursor = 0;
      (pIVar54->FontInfo).fdselect.size = 0;
      (pIVar54->FontInfo).fontdicts.data = (uchar *)0x0;
      (pIVar54->FontInfo).fontdicts.cursor = 0;
      (pIVar54->FontInfo).fontdicts.size = 0;
      (pIVar54->FontInfo).cff.data = data + sVar50;
      (pIVar54->FontInfo).cff.cursor = 0;
      (pIVar54->FontInfo).cff.size = 0x20000000;
      puVar62 = (pIVar54->FontInfo).cff.data;
      uVar32 = (pIVar54->FontInfo).cff.cursor;
      uVar33 = (pIVar54->FontInfo).cff.size;
      asStack_238[0].data._0_4_ = (int)puVar62;
      asStack_238[0].data._4_4_ = (undefined4)((ulong)puVar62 >> 0x20);
      asStack_238[0].cursor = uVar32;
      asStack_238[0].size = uVar33;
      stbtt__buf_skip(asStack_238,2);
      lVar57 = (long)asStack_238[0].cursor;
      uVar82 = 0;
      if (asStack_238[0].cursor < asStack_238[0].size) {
        asStack_238[0].cursor = asStack_238[0].cursor + 1;
        uVar82 = (uint)*(byte *)(CONCAT44(asStack_238[0].data._4_4_,(int)asStack_238[0].data) +
                                lVar57);
      }
      stbtt__buf_seek(asStack_238,uVar82);
      stbtt__cff_get_index(asStack_238);
      sVar121 = stbtt__cff_get_index(asStack_238);
      IStack_3e8 = (ImVector<stbrp_rect>)stbtt__cff_index_get(sVar121,0);
      stbtt__cff_get_index(asStack_238);
      sVar121 = stbtt__cff_get_index(asStack_238);
      (pIVar54->FontInfo).gsubrs = sVar121;
      stbtt__dict_get_ints((stbtt__buf *)&IStack_3e8,0x11,1,(stbtt_uint32 *)auStack_488);
      stbtt__dict_get_ints((stbtt__buf *)&IStack_3e8,0x106,1,(stbtt_uint32 *)&IStack_3b8);
      stbtt__dict_get_ints((stbtt__buf *)&IStack_3e8,0x124,1,(stbtt_uint32 *)&uStack_418);
      stbtt__dict_get_ints((stbtt__buf *)&IStack_3e8,0x125,1,&sStack_494);
      sVar121.data._4_4_ = asStack_238[0].data._4_4_;
      sVar121.data._0_4_ = (int)asStack_238[0].data;
      sVar121.cursor = asStack_238[0].cursor;
      sVar121.size = asStack_238[0].size;
      sVar121 = stbtt__get_subrs(sVar121,(stbtt__buf)IStack_3e8);
      sVar50 = sStack_494;
      (pIVar54->FontInfo).subrs = sVar121;
      if ((IStack_3b8.Size != 2) || (uVar104 = auStack_488._0_4_, auStack_488._0_4_ == 0))
      goto LAB_00157965;
      if ((stbtt_uint32)uStack_418 != 0) {
        if (sStack_494 == 0) goto LAB_00157965;
        stbtt__buf_seek(asStack_238,(stbtt_uint32)uStack_418);
        sVar121 = stbtt__cff_get_index(asStack_238);
        (pIVar54->FontInfo).fontdicts = sVar121;
        sVar121 = stbtt__buf_range(asStack_238,sVar50,asStack_238[0].size - sVar50);
        (pIVar54->FontInfo).fdselect = sVar121;
      }
      stbtt__buf_seek(asStack_238,uVar104);
      sVar121 = stbtt__cff_get_index(asStack_238);
      (pIVar54->FontInfo).charstrings = sVar121;
    }
    else if ((float)uStack_490 == 0.0) goto LAB_00157965;
    sVar50 = stbtt__find_table(data,auStack_448._0_4_,"maxp");
    if (sVar50 == 0) {
      uVar82 = 0xffff;
    }
    else {
      uVar82 = (uint)(ushort)(*(ushort *)(data + (ulong)sVar50 + 4) << 8 |
                             *(ushort *)(data + (ulong)sVar50 + 4) >> 8);
    }
    (pIVar54->FontInfo).numGlyphs = uVar82;
    uVar67 = *(ushort *)(data + (ulong)sVar44 + 2);
    (pIVar54->FontInfo).index_map = 0;
    uVar94 = (ulong)(ushort)(uVar67 << 8 | uVar67 >> 8);
    uVar82 = sVar44 + 4;
    iVar51 = 0;
    while (bVar43 = uVar94 != 0, uVar94 = uVar94 - 1, bVar43) {
      uVar67 = *(ushort *)(data + uVar82) << 8 | *(ushort *)(data + uVar82) >> 8;
      if ((uVar67 == 0) ||
         ((uVar67 == 3 &&
          ((uVar67 = *(ushort *)(data + (ulong)uVar82 + 2) << 8 |
                     *(ushort *)(data + (ulong)uVar82 + 2) >> 8, uVar67 == 10 || (uVar67 == 1))))))
      {
        sVar50 = ttULONG(data + (ulong)uVar82 + 4);
        iVar51 = sVar50 + sVar44;
        (pIVar54->FontInfo).index_map = iVar51;
      }
      uVar82 = uVar82 + 8;
    }
    if (iVar51 == 0) goto LAB_00157965;
    (pIVar54->FontInfo).indexToLocFormat =
         (uint)(ushort)(*(ushort *)(data + (long)(pIVar54->FontInfo).head + 0x32) << 8 |
                       *(ushort *)(data + (long)(pIVar54->FontInfo).head + 0x32) >> 8);
    pIVar58 = ImVector<ImFontBuildDstData>::operator[](&IStack_3d8,pIVar54->DstIndex);
    pIVar74 = pIVar55->GlyphRanges;
    if (pIVar74 == (ImWchar *)0x0) {
      pIVar74 = GetGlyphRangesDefault::ranges;
    }
    pIVar54->SrcRanges = pIVar74;
    uVar82 = pIVar54->GlyphsHighest;
    for (; (*pIVar74 != 0 && (uVar67 = pIVar74[1], uVar67 != 0)); pIVar74 = pIVar74 + 2) {
      if ((int)uVar82 <= (int)(uint)uVar67) {
        uVar82 = (uint)uVar67;
      }
      pIVar54->GlyphsHighest = uVar82;
    }
    pIVar58->SrcCount = pIVar58->SrcCount + 1;
    if ((int)uVar82 < pIVar58->GlyphsHighest) {
      uVar82 = pIVar58->GlyphsHighest;
    }
    pIVar58->GlyphsHighest = uVar82;
    iVar51 = iStack_3f8 + 1;
  }
  iVar51 = 0;
  iVar81 = 0;
  while (iVar81 < IStack_468.Size) {
    auStack_448._0_4_ = iVar81;
    pIVar54 = ImVector<ImFontBuildSrcData>::operator[](&IStack_468,iVar81);
    pIVar58 = ImVector<ImFontBuildDstData>::operator[](&IStack_3d8,pIVar54->DstIndex);
    ImBitVector::Create(&pIVar54->GlyphsSet,pIVar54->GlyphsHighest + 1);
    this_01 = &pIVar58->GlyphsSet;
    if ((pIVar58->GlyphsSet).Storage.Size == 0) {
      ImBitVector::Create(this_01,pIVar58->GlyphsHighest + 1);
    }
    for (puVar76 = pIVar54->SrcRanges;
        (uVar82 = (uint)*puVar76, *puVar76 != 0 && (uVar67 = puVar76[1], uVar67 != 0));
        puVar76 = puVar76 + 2) {
      for (; uVar82 <= uVar67; uVar82 = uVar82 + 1) {
        bVar43 = ImBitVector::TestBit(this_01,uVar82);
        if ((!bVar43) && (iVar81 = stbtt_FindGlyphIndex(&pIVar54->FontInfo,uVar82), iVar81 != 0)) {
          pIVar54->GlyphsCount = pIVar54->GlyphsCount + 1;
          pIVar58->GlyphsCount = pIVar58->GlyphsCount + 1;
          ImBitVector::SetBit(&pIVar54->GlyphsSet,uVar82);
          ImBitVector::SetBit(this_01,uVar82);
          iVar51 = iVar51 + 1;
        }
        uVar67 = puVar76[1];
      }
    }
    iVar81 = auStack_448._0_4_ + 1;
  }
  iVar81 = 0;
  while (pIVar92 = pIStack_478, iVar81 < IStack_468.Size) {
    pIVar54 = ImVector<ImFontBuildSrcData>::operator[](&IStack_468,iVar81);
    ImVector<int>::reserve(&pIVar54->GlyphsList,pIVar54->GlyphsCount);
    puVar77 = (pIVar54->GlyphsSet).Storage.Data;
    auStack_448._0_8_ = puVar77 + (pIVar54->GlyphsSet).Storage.Size;
    iVar83 = 0;
    for (; puVar77 < (ulong)auStack_448._0_8_; puVar77 = puVar77 + 1) {
      uVar82 = *puVar77;
      if (uVar82 != 0) {
        for (uVar93 = 0; uVar93 != 0x20; uVar93 = uVar93 + 1) {
          if ((uVar82 >> (uVar93 & 0x1f) & 1) != 0) {
            asStack_238[0].data._0_4_ = uVar93 + iVar83;
            ImVector<int>::push_back(&pIVar54->GlyphsList,(int *)asStack_238);
          }
        }
      }
      iVar83 = iVar83 + 0x20;
    }
    ImVector<unsigned_int>::clear(&(pIVar54->GlyphsSet).Storage);
    iVar81 = iVar81 + 1;
    if ((pIVar54->GlyphsList).Size != pIVar54->GlyphsCount) {
      __assert_fail("src_tmp.GlyphsList.Size == src_tmp.GlyphsCount",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_draw.cpp"
                    ,0x96d,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
    }
  }
  for (iVar81 = 0; iVar81 < IStack_3d8.Size; iVar81 = iVar81 + 1) {
    pIVar58 = ImVector<ImFontBuildDstData>::operator[](&IStack_3d8,iVar81);
    ImVector<unsigned_int>::clear(&(pIVar58->GlyphsSet).Storage);
  }
  ImVector<ImFontBuildDstData>::clear(&IStack_3d8);
  IStack_3e8 = (ImVector<stbrp_rect>)ZEXT816(0);
  IStack_3b8.Size = 0;
  IStack_3b8.Capacity = 0;
  IStack_3b8.Data = (stbtt_packedchar *)0x0;
  ImVector<stbrp_rect>::resize(&IStack_3e8,iVar51);
  pIVar80 = (ImVector<ImFontConfig> *)auStack_488._8_8_;
  ImVector<stbtt_packedchar>::resize(&IStack_3b8,iVar51);
  uVar94 = 0;
  memset(IStack_3e8.Data,0,(long)IStack_3e8.Size << 4);
  memset(IStack_3b8.Data,0,(long)IStack_3b8.Size * 0x1c);
  iVar81 = 0;
  iVar51 = 0;
  iVar83 = 0;
  while( true ) {
    iVar52 = (int)uVar94;
    if (IStack_468.Size <= iVar52) break;
    pIVar54 = ImVector<ImFontBuildSrcData>::operator[](&IStack_468,iVar52);
    if (pIVar54->GlyphsCount != 0) {
      psVar59 = ImVector<stbrp_rect>::operator[](&IStack_3e8,iVar51);
      pIVar54->Rects = psVar59;
      psVar60 = ImVector<stbtt_packedchar>::operator[](&IStack_3b8,iVar81);
      pIVar54->PackedChars = psVar60;
      iVar91 = pIVar54->GlyphsCount;
      pIVar55 = ImVector<ImFontConfig>::operator[](pIVar80,iVar52);
      fVar98 = pIVar55->SizePixels;
      (pIVar54->PackRange).font_size = fVar98;
      (pIVar54->PackRange).first_unicode_codepoint_in_range = 0;
      (pIVar54->PackRange).array_of_unicode_codepoints = (pIVar54->GlyphsList).Data;
      iVar52 = (pIVar54->GlyphsList).Size;
      (pIVar54->PackRange).num_chars = iVar52;
      (pIVar54->PackRange).chardata_for_range = pIVar54->PackedChars;
      (pIVar54->PackRange).h_oversample = (uchar)pIVar55->OversampleH;
      (pIVar54->PackRange).v_oversample = (uchar)pIVar55->OversampleV;
      uStack_490 = uVar94;
      if (fVar98 <= 0.0) {
        auStack_448._4_4_ = 0x80000000;
        auStack_448._8_4_ = 0x80000000;
        auStack_448._12_4_ = 0x80000000;
        uVar67 = *(ushort *)((pIVar54->FontInfo).data + (long)(pIVar54->FontInfo).head + 0x12);
        auStack_448._0_4_ = -fVar98 / (float)(ushort)(uVar67 << 8 | uVar67 >> 8);
      }
      else {
        auStack_448._0_4_ = stbtt_ScaleForPixelHeight(&pIVar54->FontInfo,fVar98);
        auStack_448._4_4_ = extraout_XMM0_Db;
        auStack_448._8_4_ = extraout_XMM0_Dc;
        auStack_448._12_4_ = extraout_XMM0_Dd;
      }
      iVar51 = iVar51 + iVar91;
      iVar81 = iVar81 + iVar91;
      iVar91 = pIVar92->TexGlyphPadding;
      lVar57 = 6;
      for (lVar95 = 0; pIVar80 = (ImVector<ImFontConfig> *)auStack_488._8_8_, pIVar92 = pIStack_478,
          uVar94 = uStack_490, lVar95 < iVar52; lVar95 = lVar95 + 1) {
        piVar61 = ImVector<int>::operator[](&pIVar54->GlyphsList,(int)lVar95);
        iVar52 = stbtt_FindGlyphIndex(&pIVar54->FontInfo,*piVar61);
        if (iVar52 == 0) {
          __assert_fail("glyph_index_in_font != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_draw.cpp"
                        ,0x99c,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
        }
        stbtt_GetGlyphBitmapBoxSubpixel
                  (&pIVar54->FontInfo,iVar52,(float)pIVar55->OversampleH * (float)auStack_448._0_4_,
                   (float)pIVar55->OversampleV * (float)auStack_448._0_4_,(float)auStack_448._0_4_,
                   in_XMM3._0_4_,(int *)asStack_238,(int *)auStack_488,(int *)&uStack_418,
                   (int *)&sStack_494);
        uVar82 = (pIVar55->OversampleH +
                 (((stbtt_uint32)uStack_418 + iVar91) - (int)asStack_238[0].data)) - 1;
        psVar59 = pIVar54->Rects;
        *(short *)((long)psVar59 + lVar57 + -2) = (short)uVar82;
        uVar93 = (pIVar55->OversampleV + ((sStack_494 + iVar91) - auStack_488._0_4_)) - 1;
        *(short *)((long)&psVar59->id + lVar57) = (short)uVar93;
        iVar83 = iVar83 + (uVar93 & 0xffff) * (uVar82 & 0xffff);
        iVar52 = (pIVar54->GlyphsList).Size;
        lVar57 = lVar57 + 0x10;
      }
    }
    uVar94 = (ulong)((int)uVar94 + 1);
  }
  pIVar92->TexHeight = 0;
  iStack_498 = pIVar92->TexDesiredWidth;
  if (iStack_498 < 1) {
    iVar51 = (int)SQRT((float)iVar83);
    iStack_498 = 0x1000;
    if ((iVar51 < 0xb33) && (iStack_498 = 0x800, iVar51 < 0x599)) {
      iStack_498 = (uint)(0x2cb < iVar51) * 0x200 + 0x200;
    }
  }
  pIVar92->TexWidth = iStack_498;
  uVar82 = pIVar92->TexGlyphPadding;
  ptr = (stbrp_context *)ImGui::MemAlloc(0x48);
  iVar51 = iStack_498 - uVar82;
  psStack_430 = (stbrp_node *)ImGui::MemAlloc((long)iVar51 << 4);
  if ((ptr == (stbrp_context *)0x0) || (psStack_430 == (stbrp_node *)0x0)) {
    if (ptr != (stbrp_context *)0x0) {
      ImGui::MemFree(ptr);
    }
    if (psStack_430 != (stbrp_node *)0x0) {
      ImGui::MemFree(psStack_430);
    }
    psStack_430 = (stbrp_node *)0x0;
    uVar82 = 0;
    iStack_498 = 0;
    ptr = (stbrp_context *)0x0;
  }
  else {
    if (((int)uVar82 < -0x7fff) || (0xffff < iVar51)) {
      __assert_fail("width <= 0xffff && height <= 0xffff",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imstb_rectpack.h"
                    ,0x10a,"void stbrp_init_target(stbrp_context *, int, int, stbrp_node *, int)");
    }
    uVar93 = iVar51 - 1;
    uVar89 = 0;
    psVar20 = psStack_430;
    uVar94 = uVar89;
    if (0 < (int)uVar93) {
      uVar89 = (ulong)uVar93;
      uVar94 = uVar89;
    }
    while( true ) {
      bVar43 = uVar89 == 0;
      uVar89 = uVar89 - 1;
      if (bVar43) break;
      psVar20->next = psVar20 + 1;
      psVar20 = psVar20 + 1;
    }
    psStack_430[uVar94].next = (stbrp_node *)0x0;
    ptr->init_mode = 1;
    ptr->heuristic = 0;
    ptr->free_head = psStack_430;
    ptr->active_head = ptr->extra;
    ptr->width = iVar51;
    ptr->height = 0x8000 - uVar82;
    ptr->num_nodes = iVar51;
    ptr->align = (int)(uVar93 + iVar51) / iVar51;
    ptr->extra[0].x = 0;
    ptr->extra[0].y = 0;
    ptr->extra[0].next = ptr->extra + 1;
    ptr->extra[1].x = (stbrp_coord)iVar51;
    ptr->extra[1].y = 0xffff;
    ptr->extra[1].next = (stbrp_node *)0x0;
  }
  psStack_350 = ptr;
  ImFontAtlasBuildPackCustomRects(pIVar92,ptr);
  for (iVar51 = 0; pIVar80 = (ImVector<ImFontConfig> *)auStack_488._8_8_, iVar51 < IStack_468.Size;
      iVar51 = iVar51 + 1) {
    pIVar54 = ImVector<ImFontBuildSrcData>::operator[](&IStack_468,iVar51);
    if (pIVar54->GlyphsCount != 0) {
      stbrp_pack_rects(psStack_350,pIVar54->Rects,pIVar54->GlyphsCount);
      psVar59 = pIVar54->Rects;
      uVar94 = (ulong)(uint)pIVar54->GlyphsCount;
      if (pIVar54->GlyphsCount < 1) {
        uVar94 = 0;
      }
      for (lVar57 = 0; uVar94 * 0x10 != lVar57; lVar57 = lVar57 + 0x10) {
        if (*(int *)((long)&psVar59->was_packed + lVar57) != 0) {
          iVar81 = (uint)*(ushort *)((long)&psVar59->h + lVar57) +
                   (uint)*(ushort *)((long)&psVar59->y + lVar57);
          if (iVar81 < pIVar92->TexHeight) {
            iVar81 = pIVar92->TexHeight;
          }
          pIVar92->TexHeight = iVar81;
        }
      }
    }
  }
  uVar93 = pIVar92->TexHeight;
  if ((pIVar92->Flags & 1) == 0) {
    uVar93 = (int)(uVar93 - 1) >> 1 | uVar93 - 1;
    uVar93 = (int)uVar93 >> 2 | uVar93;
    uVar93 = (int)uVar93 >> 4 | uVar93;
    uVar93 = (int)uVar93 >> 8 | uVar93;
    uVar93 = (int)uVar93 >> 0x10 | uVar93;
  }
  iVar51 = uVar93 + 1;
  pIVar92->TexHeight = iVar51;
  auVar107._0_4_ = (float)pIVar92->TexWidth;
  auVar107._4_4_ = (float)iVar51;
  auVar107._8_8_ = 0;
  auVar107 = divps(_DAT_0027a290,auVar107);
  pIVar92->TexUvScale = auVar107._0_8_;
  puVar62 = (uchar *)ImGui::MemAlloc((long)(iVar51 * pIVar92->TexWidth));
  pIVar92->TexPixelsAlpha8 = puVar62;
  memset(puVar62,0,(long)pIVar92->TexHeight * (long)pIVar92->TexWidth);
  uVar94 = 0;
  puStack_398 = pIVar92->TexPixelsAlpha8;
  lVar57 = (long)iStack_498;
  auStack_278 = pshuflw(ZEXT416(uVar82),ZEXT416(uVar82),0);
  puStack_2f0 = puStack_398 + 1;
  while( true ) {
    iVar51 = (int)uVar94;
    if (IStack_468.Size <= iVar51) break;
    pIStack_300 = ImVector<ImFontConfig>::operator[](pIVar80,iVar51);
    uStack_2f8 = uVar94;
    pIVar54 = ImVector<ImFontBuildSrcData>::operator[](&IStack_468,iVar51);
    if (pIVar54->GlyphsCount != 0) {
      psVar59 = pIVar54->Rects;
      bVar43 = true;
      lVar95 = 0;
      pIStack_390 = pIVar54;
      psStack_2e8 = psVar59;
      while( true ) {
        uVar106 = 0x80000000;
        uVar105 = 0x80000000;
        uVar104 = 0x80000000;
        if (!bVar43) break;
        fVar98 = (pIVar54->PackRange).font_size;
        if (fVar98 <= 0.0) {
          uVar67 = *(ushort *)((pIVar54->FontInfo).data + (long)(pIVar54->FontInfo).head + 0x12);
          fStack_248 = -fVar98 / (float)(ushort)(uVar67 << 8 | uVar67 >> 8);
        }
        else {
          fStack_248 = stbtt_ScaleForPixelHeight(&pIVar54->FontInfo,fVar98);
          uVar104 = extraout_var._0_4_;
          uVar105 = extraout_var._4_4_;
          uVar106 = extraout_var._8_4_;
        }
        uVar94._0_1_ = (pIVar54->PackRange).h_oversample;
        uVar17 = (pIVar54->PackRange).v_oversample;
        uVar18 = *(undefined6 *)&(pIVar54->PackRange).field_0x22;
        uVar94._1_7_ = CONCAT61(uVar18,uVar17);
        auVar23._8_6_ = 0;
        auVar23._0_8_ = uVar94;
        auVar23[0xe] = (char)((uint6)uVar18 >> 0x28);
        auVar25._8_4_ = 0;
        auVar25._0_8_ = uVar94;
        auVar25[0xc] = (char)((uint6)uVar18 >> 0x20);
        auVar25._13_2_ = auVar23._13_2_;
        auVar26._8_4_ = 0;
        auVar26._0_8_ = uVar94;
        auVar26._12_3_ = auVar25._12_3_;
        auVar27._8_2_ = 0;
        auVar27._0_8_ = uVar94;
        auVar27[10] = (char)((uint6)uVar18 >> 0x18);
        auVar27._11_4_ = auVar26._11_4_;
        auVar28._8_2_ = 0;
        auVar28._0_8_ = uVar94;
        auVar28._10_5_ = auVar27._10_5_;
        auVar29[8] = (char)((uint6)uVar18 >> 0x10);
        auVar29._0_8_ = uVar94;
        auVar29._9_6_ = auVar28._9_6_;
        auVar34._7_8_ = 0;
        auVar34._0_7_ = auVar29._8_7_;
        cVar103 = (char)((uint6)uVar18 >> 8);
        Var35 = CONCAT81(SUB158(auVar34 << 0x40,7),cVar103);
        auVar40._9_6_ = 0;
        auVar40._0_9_ = Var35;
        cVar102 = (char)uVar18;
        auVar30[4] = cVar102;
        auVar30._0_4_ = (uint)uVar94;
        auVar30._5_10_ = SUB1510(auVar40 << 0x30,5);
        auVar36._11_4_ = 0;
        auVar36._0_11_ = auVar30._4_11_;
        auVar37._1_12_ = SUB1512(auVar36 << 0x20,3);
        auVar37[0] = uVar17;
        uVar67 = CONCAT11(0,(undefined1)uVar94);
        auVar31._2_13_ = auVar37;
        auVar31._0_2_ = uVar67;
        auStack_448._0_2_ = auVar37._0_2_;
        sVar21 = -auVar30._4_2_;
        uVar68 = (ushort)Var35;
        sVar22 = -uVar68;
        auStack_448._2_6_ = 0;
        auVar24._10_2_ = 0;
        auVar24._0_10_ = auVar31._0_10_;
        auVar24._12_2_ = uVar68;
        uVar42 = CONCAT42(auVar24._10_4_,auVar30._4_2_);
        auVar38._6_8_ = 0;
        auVar38._0_6_ = uVar42;
        auVar100._0_4_ = (float)uVar67;
        auVar100._4_4_ = (float)(int)CONCAT82(SUB148(auVar38 << 0x40,6),auStack_448._0_2_);
        auVar100._8_4_ = (float)(int)uVar42;
        auVar100._12_4_ = (float)uVar68;
        auStack_268 = divps(_DAT_0027a290,auVar100);
        auVar117[0] = -((undefined1)uVar94 == 0);
        auVar117[1] = -((undefined1)uVar94 == 0);
        auVar117[2] = -((undefined1)uVar94 == 0);
        auVar117[3] = -((undefined1)uVar94 == 0);
        auVar117[4] = -(uVar17 == '\0');
        auVar117[5] = -(uVar17 == '\0');
        auVar117[6] = -(uVar17 == '\0');
        auVar117[7] = -(uVar17 == '\0');
        auVar117[8] = -(cVar102 == '\0');
        auVar117[9] = -(cVar102 == '\0');
        auVar117[10] = -(cVar102 == '\0');
        auVar117[0xb] = -(cVar102 == '\0');
        auVar117[0xc] = -(cVar103 == '\0');
        auVar117[0xd] = -(cVar103 == '\0');
        auVar117[0xe] = -(cVar103 == '\0');
        auVar117[0xf] = -(cVar103 == '\0');
        Var41 = CONCAT64(CONCAT42(CONCAT22(sVar22,sVar22),sVar21),CONCAT22(sVar21,sVar22));
        auVar39._4_8_ = (long)((unkuint10)Var41 >> 0x10);
        auVar39._2_2_ = 1 - auStack_448._0_2_;
        auVar39._0_2_ = 1 - auStack_448._0_2_;
        auVar108._0_4_ = (float)(int)(short)(1 - uVar67);
        auVar108._4_4_ = (float)(auVar39._0_4_ >> 0x10);
        auVar108._8_4_ = (float)((int)((unkuint10)Var41 >> 0x10) >> 0x10);
        auVar108._12_4_ = (float)(int)sVar22;
        auStack_298._0_4_ = fStack_248 * auVar100._0_4_;
        auStack_298._4_4_ = fStack_248 * auVar100._4_4_;
        auStack_298._8_4_ = fStack_248 * auVar100._8_4_;
        auStack_298._12_4_ = fStack_248 * auVar100._12_4_;
        auVar101._0_4_ = auVar100._0_4_ + auVar100._0_4_;
        auVar101._4_4_ = auVar100._4_4_ + auVar100._4_4_;
        auVar101._8_4_ = auVar100._8_4_ + auVar100._8_4_;
        auVar101._12_4_ = auVar100._12_4_ + auVar100._12_4_;
        auStack_258 = divps(auVar108,auVar101);
        auStack_258 = ~auVar117 & auStack_258;
        lVar95 = (long)(int)lVar95;
        fVar98 = auStack_298._4_4_;
        if ((float)auStack_298._0_4_ <= auStack_298._4_4_) {
          fVar98 = (float)auStack_298._0_4_;
        }
        fStack_3ec = (0.35 / fVar98) * (0.35 / fVar98);
        uStack_320 = uVar94 & 0xff;
        uStack_328 = (ulong)((uint)uVar94._1_7_ & 0xff);
        uVar82 = (uint)uVar94 & 0xff;
        uVar94 = CONCAT44(auStack_298._4_4_,auStack_298._0_4_);
        auVar114._0_8_ = uVar94 ^ 0x8000000000000000;
        auVar114._8_4_ = auStack_298._0_4_;
        auVar114._12_4_ = -auStack_298._4_4_;
        lVar73 = 0;
        fStack_2a8 = auStack_298._4_4_;
        fStack_2a4 = auStack_298._4_4_;
        fStack_2a0 = auStack_298._4_4_;
        fStack_29c = auStack_298._4_4_;
        auStack_288 = auVar114;
        uStack_244 = uVar104;
        uStack_240 = uVar105;
        uStack_23c = uVar106;
LAB_00156033:
        fVar98 = auVar114._0_4_;
        if (lVar73 < (pIVar54->PackRange).num_chars) {
          if (((psVar59[lVar95].was_packed != 0) && (psVar84 = psVar59 + lVar95, psVar84->w != 0))
             && (psVar84->h != 0)) {
            piVar61 = (pIVar54->PackRange).array_of_unicode_codepoints;
            if (piVar61 == (int *)0x0) {
              iVar51 = (pIVar54->PackRange).first_unicode_codepoint_in_range + (int)lVar73;
            }
            else {
              iVar51 = piVar61[lVar73];
            }
            psStack_2c0 = (pIVar54->PackRange).chardata_for_range + lVar73;
            psStack_3c8 = psVar84;
            lStack_340 = lVar73;
            lStack_338 = lVar95;
            iVar81 = stbtt_FindGlyphIndex(&pIVar54->FontInfo,iVar51);
            psVar59 = psStack_3c8;
            uVar1 = psStack_3c8->w;
            uVar5 = psStack_3c8->h;
            uVar6 = psStack_3c8->x;
            uVar8 = psStack_3c8->y;
            psStack_3c8->w = uVar1 - auStack_278._0_2_;
            psStack_3c8->h = uVar5 - auStack_278._2_2_;
            psStack_3c8->x = uVar6 + auStack_278._4_2_;
            psStack_3c8->y = uVar8 + auStack_278._6_2_;
            puVar62 = (pIVar54->FontInfo).data;
            uVar67 = *(ushort *)(puVar62 + (long)(pIVar54->FontInfo).hhea + 0x22) << 8 |
                     *(ushort *)(puVar62 + (long)(pIVar54->FontInfo).hhea + 0x22) >> 8;
            iVar51 = (pIVar54->FontInfo).hmtx;
            lVar95 = (ulong)uVar67 * 4 + (long)iVar51 + -4;
            lVar73 = (ulong)uVar67 * 4 + (long)iVar51 + -3;
            if (iVar81 < (int)(uint)uVar67) {
              lVar95 = (long)(iVar81 * 4) + (long)iVar51;
              lVar73 = (long)(iVar81 * 4) + 1 + (long)iVar51;
            }
            uStack_36c = (uint)puVar62[lVar95];
            uStack_370 = (uint)puVar62[lVar73];
            auVar107 = auStack_278;
            stbtt_GetGlyphBitmapBoxSubpixel
                      (&pIVar54->FontInfo,iVar81,(float)auStack_298._0_4_,fStack_2a8,
                       auStack_278._0_4_,fVar98,&iStack_358,&iStack_35c,&iStack_2ac,&iStack_2b0);
            fVar120 = auVar107._0_4_;
            uVar67 = psVar59->x;
            puStack_380 = (uchar *)(ulong)psVar59->y;
            uStack_408 = (ulong)psVar59->w;
            uVar68 = psVar59->h;
            uVar93 = stbtt_GetGlyphShape(&pIVar54->FontInfo,iVar81,(stbtt_vertex **)&uStack_418);
            fVar75 = (float)(((int)uStack_408 - uVar82) + 1);
            stbtt_GetGlyphBitmapBoxSubpixel
                      (&pIStack_390->FontInfo,iVar81,(float)auStack_298._0_4_,fStack_2a8,fVar120,
                       fVar98,(int *)&sStack_494,(int *)&uStack_354,(int *)0x0,(int *)0x0);
            sVar50 = sStack_494;
            fStack_46c = fVar75;
            if ((fVar75 != 0.0) &&
               (uVar53 = ((uint)uVar68 - auStack_448._0_4_) + 1, uStack_388 = (ulong)uVar53,
               uVar53 != 0)) {
              puStack_380 = puStack_398 + (long)puStack_380 * lVar57 + (ulong)uVar67;
              uStack_408 = (ulong)((int)uStack_408 - uVar82);
              lVar95 = CONCAT44(uStack_418._4_4_,(stbtt_uint32)uStack_418);
              uStack_348 = (ulong)uStack_354;
              uVar89 = 0;
              uVar94 = (ulong)uVar93;
              if ((int)uVar93 < 1) {
                uVar94 = uVar89;
              }
              uVar70 = 0;
              for (; uVar94 * 0xe - uVar89 != 0; uVar89 = uVar89 + 0xe) {
                uVar70 = (ulong)((int)uVar70 + (uint)(*(char *)(lVar95 + 0xc + uVar89) == '\x01'));
              }
              if (((int)uVar70 != 0) &&
                 (pvStack_450 = ImGui::MemAlloc(uVar70 * 4), pvStack_450 != (void *)0x0)) {
                psStack_420 = (stbtt__point *)0x0;
                iVar51 = 0;
                iVar83 = 0;
                iVar81 = 0;
                do {
                  ptr_00 = psStack_420;
                  if (iVar83 == 1) {
                    psStack_420 = (stbtt__point *)ImGui::MemAlloc((long)iVar81 << 3);
                    if (psStack_420 == (stbtt__point *)0x0) {
                      ImGui::MemFree((void *)0x0);
                      ImGui::MemFree(pvStack_450);
                      break;
                    }
                  }
                  else if (iVar83 == 2) goto LAB_001564e4;
                  asStack_238[0].data._0_4_ = 0;
                  fVar98 = 0.0;
                  fVar75 = 0.0;
                  uVar93 = 0xffffffff;
                  for (lVar73 = 0; uVar94 * 0xe - lVar73 != 0; lVar73 = lVar73 + 0xe) {
                    iVar81 = (int)asStack_238[0].data;
                    switch(*(undefined1 *)(lVar95 + 0xc + lVar73)) {
                    case 1:
                      if (-1 < (int)uVar93) {
                        *(int *)((long)pvStack_450 + (ulong)uVar93 * 4) =
                             (int)asStack_238[0].data - iVar51;
                      }
                      uVar93 = uVar93 + 1;
                      auVar107 = pshuflw(ZEXT416(*(uint *)(lVar95 + lVar73)),
                                         ZEXT416(*(uint *)(lVar95 + lVar73)),0x60);
                      fVar98 = (float)(auVar107._0_4_ >> 0x10);
                      fVar75 = (float)(auVar107._4_4_ >> 0x10);
                      iVar51 = (int)asStack_238[0].data;
                      iVar81 = (int)asStack_238[0].data + 1;
                      if (psStack_420 != (stbtt__point *)0x0) {
                        psStack_420[(int)asStack_238[0].data].x = fVar98;
                        psStack_420[(int)asStack_238[0].data].y = fVar75;
                      }
                      break;
                    case 2:
                      auVar107 = pshuflw(ZEXT416(*(uint *)(lVar95 + lVar73)),
                                         ZEXT416(*(uint *)(lVar95 + lVar73)),0x60);
                      fVar98 = (float)(auVar107._0_4_ >> 0x10);
                      fVar75 = (float)(auVar107._4_4_ >> 0x10);
                      iVar81 = (int)asStack_238[0].data + 1;
                      if (psStack_420 != (stbtt__point *)0x0) {
                        psStack_420[(int)asStack_238[0].data].x = fVar98;
                        psStack_420[(int)asStack_238[0].data].y = fVar75;
                      }
                      break;
                    case 3:
                      stbtt__tesselate_curve
                                (psStack_420,(int *)asStack_238,fVar98,fVar75,
                                 (float)(int)*(short *)(lVar95 + 4 + lVar73),
                                 (float)(int)*(short *)(lVar95 + 6 + lVar73),
                                 (float)(int)*(short *)(lVar95 + lVar73),
                                 (float)(int)*(short *)(lVar95 + 2 + lVar73),fStack_3ec,0);
                      goto LAB_00156466;
                    case 4:
                      stbtt__tesselate_cubic
                                (psStack_420,(int *)asStack_238,fVar98,fVar75,
                                 (float)(int)*(short *)(lVar95 + 4 + lVar73),
                                 (float)(int)*(short *)(lVar95 + 6 + lVar73),
                                 (float)(int)*(short *)(lVar95 + 8 + lVar73),
                                 (float)(int)*(short *)(lVar95 + 10 + lVar73),
                                 (float)(int)*(short *)(lVar95 + lVar73),
                                 (float)(int)*(short *)(lVar95 + 2 + lVar73),fStack_3ec,0);
LAB_00156466:
                      auVar107 = pshuflw(ZEXT416(*(uint *)(lVar95 + lVar73)),
                                         ZEXT416(*(uint *)(lVar95 + lVar73)),0x60);
                      fVar98 = (float)(auVar107._0_4_ >> 0x10);
                      fVar75 = (float)(auVar107._4_4_ >> 0x10);
                      iVar81 = (int)asStack_238[0].data;
                    }
                    asStack_238[0].data._0_4_ = iVar81;
                  }
                  *(int *)((long)pvStack_450 + (long)(int)uVar93 * 4) =
                       (int)asStack_238[0].data - iVar51;
                  iVar83 = iVar83 + 1;
                  iVar81 = (int)asStack_238[0].data;
                } while( true );
              }
            }
            goto LAB_0015706f;
          }
          goto LAB_001575f9;
        }
        bVar43 = false;
      }
      fVar98 = pIStack_300->RasterizerMultiply;
      if ((fVar98 != 1.0) || (NAN(fVar98))) {
        ImFontAtlasBuildMultiplyCalcLookupTable((uchar *)asStack_238,fVar98);
        piVar61 = &pIVar54->Rects->was_packed;
        for (iVar51 = 0; pIVar80 = (ImVector<ImFontConfig> *)auStack_488._8_8_,
            iVar51 < pIVar54->GlyphsCount; iVar51 = iVar51 + 1) {
          if (*piVar61 != 0) {
            ImFontAtlasBuildMultiplyRectAlpha8
                      ((uchar *)asStack_238,pIVar92->TexPixelsAlpha8,(uint)*(ushort *)(piVar61 + -1)
                       ,(uint)*(stbrp_coord *)((long)piVar61 + -2),(uint)*(ushort *)(piVar61 + -2),
                       (uint)*(stbrp_coord *)((long)piVar61 + -6),pIVar92->TexWidth);
          }
          piVar61 = piVar61 + 4;
        }
      }
      pIVar54->Rects = (stbrp_rect *)0x0;
    }
    uVar94 = (ulong)((int)uStack_2f8 + 1);
  }
  ImGui::MemFree(psStack_430);
  ImGui::MemFree(psStack_350);
  ImVector<stbrp_rect>::clear(&IStack_3e8);
  for (iVar51 = 0; pIVar92 = pIStack_478, iVar51 < IStack_468.Size; iVar51 = iVar51 + 1) {
    pIVar54 = ImVector<ImFontBuildSrcData>::operator[](&IStack_468,iVar51);
    if (pIVar54->GlyphsCount != 0) {
      pIVar55 = ImVector<ImFontConfig>::operator[]
                          ((ImVector<ImFontConfig> *)auStack_488._8_8_,iVar51);
      pIVar14 = pIVar55->DstFont;
      fVar98 = stbtt_ScaleForPixelHeight(&pIVar54->FontInfo,pIVar55->SizePixels);
      puVar62 = (pIVar54->FontInfo).data;
      lVar57 = (long)(pIVar54->FontInfo).hhea;
      uVar67 = *(ushort *)(puVar62 + lVar57 + 4);
      uVar67 = uVar67 << 8 | uVar67 >> 8;
      fVar75 = -1.0;
      if (0 < (short)uVar67) {
        fVar75 = 1.0;
      }
      uVar68 = *(ushort *)(puVar62 + lVar57 + 6);
      uVar68 = uVar68 << 8 | uVar68 >> 8;
      fVar120 = -1.0;
      if (0 < (short)uVar68) {
        fVar120 = 1.0;
      }
      ImFontAtlasBuildSetupFont
                (pIStack_478,pIVar14,pIVar55,
                 (float)(int)((float)(int)(short)uVar67 * fVar98 + fVar75),
                 (float)(int)((float)(int)(short)uVar68 * fVar98 + fVar120));
      fVar98 = (pIVar55->GlyphOffset).x;
      auStack_448 = ZEXT416((uint)((float)(int)(pIVar14->Ascent + 0.5) + (pIVar55->GlyphOffset).y));
      lVar57 = 0;
      for (lVar95 = 0; lVar95 < pIVar54->GlyphsCount; lVar95 = lVar95 + 1) {
        pIVar74 = (ImWchar *)ImVector<int>::operator[](&pIVar54->GlyphsList,(int)lVar95);
        psVar60 = pIVar54->PackedChars;
        fVar120 = 1.0 / (float)pIStack_478->TexHeight;
        fVar75 = 1.0 / (float)pIStack_478->TexWidth;
        ImFont::AddGlyph(pIVar14,pIVar55,*pIVar74,
                         *(float *)((long)&psVar60->xoff + lVar57) + 0.0 + fVar98,
                         *(float *)((long)&psVar60->yoff + lVar57) + 0.0 + (float)auStack_448._0_4_,
                         *(float *)((long)&psVar60->xoff2 + lVar57) + 0.0 + fVar98,
                         *(float *)((long)&psVar60->yoff2 + lVar57) + 0.0 + (float)auStack_448._0_4_
                         ,(float)*(ushort *)((long)&psVar60->x0 + lVar57) * fVar75,
                         (float)*(ushort *)((long)&psVar60->y0 + lVar57) * fVar120,
                         (float)*(ushort *)((long)&psVar60->x1 + lVar57) * fVar75,
                         (float)*(ushort *)((long)&psVar60->y1 + lVar57) * fVar120,
                         *(float *)((long)&psVar60->xadvance + lVar57));
        lVar57 = lVar57 + 0x1c;
      }
    }
  }
  for (iVar51 = 0; iVar51 < IStack_468.Size; iVar51 = iVar51 + 1) {
    pIVar54 = ImVector<ImFontBuildSrcData>::operator[](&IStack_468,iVar51);
    ImFontBuildSrcData::~ImFontBuildSrcData(pIVar54);
  }
  ImFontAtlasBuildFinish(pIVar92);
  ImVector<stbtt_packedchar>::~ImVector(&IStack_3b8);
  ImVector<stbrp_rect>::~ImVector(&IStack_3e8);
LAB_00157965:
  bVar43 = iStack_374 <= iStack_3f8;
  ImVector<ImFontBuildDstData>::~ImVector(&IStack_3d8);
  ImVector<ImFontBuildSrcData>::~ImVector(&IStack_468);
  return bVar43;
LAB_001564e4:
  if (psStack_420 != (stbtt__point *)0x0) {
    iVar51 = 0;
    for (uVar94 = 0; uVar70 != uVar94; uVar94 = uVar94 + 1) {
      iVar51 = iVar51 + *(int *)((long)pvStack_450 + uVar94 * 4);
    }
    psVar63 = (stbtt__edge *)ImGui::MemAlloc((long)(iVar51 + 1) * 0x14);
    psStack_428 = psVar63;
    if (psVar63 != (stbtt__edge *)0x0) {
      iVar51 = 0;
      iVar81 = 0;
      for (uVar94 = 0; uVar94 != uVar70; uVar94 = uVar94 + 1) {
        iVar83 = *(int *)((long)pvStack_450 + uVar94 * 4);
        uVar87 = (ulong)(iVar83 - 1);
        iVar52 = iVar83;
        for (uVar89 = 0; iVar91 = (int)uVar87, (long)uVar89 < (long)iVar52; uVar89 = uVar89 + 1) {
          fVar98 = ptr_00[(long)iVar51 + (long)iVar91].y;
          fVar75 = ptr_00[(long)iVar51 + uVar89].y;
          if ((fVar98 != fVar75) || (NAN(fVar98) || NAN(fVar75))) {
            iVar52 = (int)uVar89;
            if (fVar98 <= fVar75) {
              iVar52 = iVar91;
              iVar91 = (int)uVar89;
            }
            psVar63[iVar81].invert = (uint)(fVar75 < fVar98);
            sVar3 = ptr_00[(long)iVar51 + (long)iVar91];
            sVar4 = ptr_00[(long)iVar51 + (long)iVar52];
            psVar85 = psVar63 + iVar81;
            psVar85->x0 = sVar3.x * auStack_288._0_4_ + 0.0;
            psVar85->y0 = sVar3.y * auStack_288._4_4_ + 0.0;
            psVar85->x1 = sVar4.x * auStack_288._8_4_ + 0.0;
            psVar85->y1 = sVar4.y * auStack_288._12_4_ + 0.0;
            iVar81 = iVar81 + 1;
            iVar52 = *(int *)((long)pvStack_450 + uVar94 * 4);
          }
          uVar87 = uVar89 & 0xffffffff;
        }
        iVar51 = iVar83 + iVar51;
      }
      stbtt__sort_edges_quicksort(psVar63,iVar81);
      for (uVar94 = 1; (long)uVar94 < (long)iVar81; uVar94 = uVar94 + 1) {
        uVar2 = psStack_428[uVar94].x0;
        uVar7 = psStack_428[uVar94].y0;
        asStack_238[0].cursor = psStack_428[uVar94].invert;
        uVar12 = psStack_428[uVar94].x1;
        uVar19 = psStack_428[uVar94].y1;
        psVar85 = psVar63;
        for (uVar89 = uVar94; 0 < (long)uVar89; uVar89 = uVar89 - 1) {
          if (psVar85->y0 <= (float)uVar7) goto LAB_0015669b;
          psVar85[1].invert = psVar85->invert;
          fVar98 = psVar85->y0;
          fVar75 = psVar85->x1;
          fVar120 = psVar85->y1;
          psVar85[1].x0 = psVar85->x0;
          psVar85[1].y0 = fVar98;
          psVar85[1].x1 = fVar75;
          psVar85[1].y1 = fVar120;
          psVar85 = psVar85 + -1;
        }
        uVar89 = 0;
LAB_0015669b:
        iVar51 = (int)uVar89;
        if (uVar94 != (uVar89 & 0xffffffff)) {
          psStack_428[iVar51].x0 = (float)uVar2;
          psStack_428[iVar51].y0 = (float)uVar7;
          psStack_428[iVar51].x1 = (float)uVar12;
          psStack_428[iVar51].y1 = (float)uVar19;
          psStack_428[iVar51].invert = asStack_238[0].cursor;
        }
        psVar63 = psVar63 + 1;
        asStack_238[0].data._0_4_ = uVar12;
        asStack_238[0].data._4_4_ = uVar19;
      }
      auStack_488._0_8_ = (stbtt__active_edge *)0x0;
      scanline = asStack_238;
      if (0x3f < (int)uStack_408) {
        scanline = (stbtt__buf *)ImGui::MemAlloc((ulong)(uint)fStack_46c * 8 + 4);
      }
      lStack_2d8 = (long)(int)fStack_46c;
      pfStack_400 = (float *)((long)&scanline->data + lStack_2d8 * 4);
      iVar51 = (int)uStack_388;
      fStack_364 = (float)(int)sVar50;
      psStack_428[iVar81].y0 = (float)((int)uStack_348 + iVar51) + 1.0;
      sStack_2c8 = lStack_2d8 * 4;
      sStack_2d0 = (long)(int)uStack_408 * 4 + 8;
      fStack_40c = (float)(int)fStack_46c;
      uVar94 = 0;
      if ((int)fStack_46c < 1) {
        fStack_46c = 0.0;
      }
      lStack_2e0 = 0;
      if (0 < lStack_2d8) {
        lStack_2e0 = lStack_2d8;
      }
      uStack_388 = uStack_388 & 0xffffffff;
      if (iVar51 < 1) {
        uStack_388 = uVar94;
      }
      psVar78 = (stbtt__active_edge *)0x0;
      iStack_3f0 = 0;
      puStack_3c0 = (undefined8 *)0x0;
      uVar89 = uStack_348 & 0xffffffff;
      psStack_330 = psStack_428;
      iVar51 = 0;
      while (puVar64 = puStack_3c0, iVar51 != (int)uStack_388) {
        iStack_368 = (int)uVar89;
        fVar98 = (float)iStack_368;
        fVar75 = fVar98 + 1.0;
        iStack_3f4 = iVar51;
        memset(scanline,0,sStack_2c8);
        memset(pfStack_400,0,sStack_2d0);
        psVar65 = (stbtt__active_edge *)auStack_488;
        while (psVar71 = psVar65, psVar15 = psVar71->next, psVar15 != (stbtt__active_edge *)0x0) {
          psVar65 = psVar15;
          if (psVar15->ey <= fVar98) {
            psVar71->next = psVar15->next;
            if ((psVar15->direction == 0.0) && (!NAN(psVar15->direction))) {
              __assert_fail("z->direction",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imstb_truetype.h"
                            ,0xc63,
                            "void stbtt__rasterize_sorted_edges(stbtt__bitmap *, stbtt__edge *, int, int, int, int, void *)"
                           );
            }
            psVar15->direction = 0.0;
            psVar15->next = psVar78;
            psVar65 = psVar71;
            psVar78 = psVar15;
          }
        }
        uStack_2b8 = uVar94;
        bVar43 = (int)uStack_348 != 0;
        bVar97 = iStack_3f4 == 0;
        for (psVar63 = psStack_330; fVar120 = psVar63->y0, fVar120 <= fVar75; psVar63 = psVar63 + 1)
        {
          fVar99 = psVar63->y1;
          if ((fVar120 != fVar99) || (psVar65 = psVar78, NAN(fVar120) || NAN(fVar99))) {
            if (psVar78 == (stbtt__active_edge *)0x0) {
              if (iStack_3f0 == 0) {
                puVar64 = (undefined8 *)ImGui::MemAlloc(0x6408);
                if (puVar64 == (undefined8 *)0x0) {
                  __assert_fail("z != __null",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imstb_truetype.h"
                                ,0xad1,
                                "stbtt__active_edge *stbtt__new_active(stbtt__hheap *, stbtt__edge *, int, float, void *)"
                               );
                }
                *puVar64 = puStack_3c0;
                fVar120 = psVar63->y0;
                fVar99 = psVar63->y1;
                iStack_3f0 = 799;
              }
              else {
                iStack_3f0 = iStack_3f0 + -1;
                puVar64 = puStack_3c0;
              }
              puStack_3c0 = puVar64;
              psVar78 = (stbtt__active_edge *)(puVar64 + (long)iStack_3f0 * 4 + 1);
              psVar65 = (stbtt__active_edge *)0x0;
            }
            else {
              psVar65 = psVar78->next;
            }
            fVar113 = psVar63->x0;
            fVar112 = (psVar63->x1 - fVar113) / (fVar99 - fVar120);
            psVar78->fdx = fVar112;
            psVar78->fdy = (float)(-(uint)(fVar112 != 0.0) & (uint)(1.0 / fVar112));
            psVar78->fx = ((fVar98 - fVar120) * fVar112 + fVar113) - fStack_364;
            psVar78->direction = *(float *)(&DAT_002a0834 + (ulong)(psVar63->invert == 0) * 4);
            psVar78->sy = fVar120;
            psVar78->ey = fVar99;
            psVar78->next = (stbtt__active_edge *)0x0;
            if (fVar99 < fVar98 && (bVar97 && bVar43)) {
              psVar78->ey = fVar98;
              fVar99 = fVar98;
            }
            if (fVar99 < fVar98) {
              __assert_fail("z->ey >= scan_y_top",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imstb_truetype.h"
                            ,0xc76,
                            "void stbtt__rasterize_sorted_edges(stbtt__bitmap *, stbtt__edge *, int, int, int, int, void *)"
                           );
            }
            psVar78->next = (stbtt__active_edge *)auStack_488._0_8_;
            auStack_488._0_8_ = psVar78;
          }
          psVar78 = psVar65;
        }
        psStack_330 = psVar63;
        psVar65 = (stbtt__active_edge *)auStack_488._0_8_;
        if ((stbtt__active_edge *)auStack_488._0_8_ != (stbtt__active_edge *)0x0) {
          for (; psVar65 != (stbtt__active_edge *)0x0; psVar65 = psVar65->next) {
            fVar120 = psVar65->ey;
            if (fVar120 < fVar98) {
              __assert_fail("e->ey >= y_top",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imstb_truetype.h"
                            ,0xba5,
                            "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                           );
            }
            fVar99 = psVar65->fx;
            auVar118._0_8_ = CONCAT44(0,fVar99);
            auVar118._8_8_ = 0;
            fVar113 = psVar65->fdx;
            if ((fVar113 != 0.0) || (NAN(fVar113))) {
              fVar112 = psVar65->sy;
              if (fVar75 < fVar112) {
                __assert_fail("e->sy <= y_bottom && e->ey >= y_top",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imstb_truetype.h"
                              ,3000,
                              "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                             );
              }
              fVar119 = fVar113 + fVar99;
              fVar116 = (float)(~-(uint)(fVar98 < fVar112) & (uint)fVar99 |
                               (uint)((fVar112 - fVar98) * fVar113 + fVar99) &
                               -(uint)(fVar98 < fVar112));
              if ((((fVar116 < 0.0) ||
                   (fVar109 = (float)(~-(uint)(fVar120 < fVar75) & (uint)fVar119 |
                                     (uint)((fVar120 - fVar98) * fVar113 + fVar99) &
                                     -(uint)(fVar120 < fVar75)), fVar109 < 0.0)) ||
                  (fStack_40c <= fVar116)) || (fStack_40c <= fVar109)) {
                auStack_318 = auVar118;
                auStack_3a8 = ZEXT416((uint)fVar119);
                fStack_360 = fVar113;
                uVar104 = 0;
                uVar105 = 0;
                fVar120 = 0.0;
                while (fStack_46c != fVar120) {
                  fVar113 = (float)(int)fVar120;
                  fVar109 = (float)(int)((int)fVar120 + 1U);
                  fVar99 = auStack_318._0_4_;
                  fVar112 = (fVar113 - fVar99) / fStack_360 + fVar98;
                  fVar116 = (fVar109 - fVar99) / fStack_360 + fVar98;
                  if ((fVar113 <= fVar99) || (fVar119 <= fVar109)) {
                    if ((fVar113 <= fVar119) || (fVar99 <= fVar109)) {
                      fVar115 = fVar98;
                      if (((fVar113 <= fVar99) || (fVar119 <= fVar113)) &&
                         ((fVar113 <= fVar119 || (fVar99 <= fVar113)))) {
                        if (((fVar99 < fVar109) && (fVar109 < fVar119)) ||
                           ((fVar119 < fVar109 && (fVar109 < fVar99)))) {
                          uStack_490 = CONCAT44(uStack_490._4_4_,fVar116);
                          fVar112 = fVar98;
                          goto LAB_00156c63;
                        }
                        auVar111._4_4_ = 0;
                        auVar111._0_4_ = fVar119;
                        auVar111._8_4_ = uVar104;
                        auVar111._12_4_ = uVar105;
                        fVar113 = fVar99;
                        fVar112 = fVar98;
                        goto LAB_00156d17;
                      }
                    }
                    else {
                      uStack_490 = CONCAT44(uStack_490._4_4_,fVar116);
                      stbtt__handle_clipped_edge
                                ((float *)scanline,(int)fVar120,psVar65,fVar99,fVar98,fVar109,
                                 fVar116);
                      fVar99 = fVar109;
                      fVar115 = (float)uStack_490;
                    }
                    stbtt__handle_clipped_edge
                              ((float *)scanline,(int)fVar120,psVar65,fVar99,fVar115,fVar113,fVar112
                              );
                    auVar111 = auStack_3a8;
                  }
                  else {
                    uStack_490 = CONCAT44(uStack_490._4_4_,fVar116);
                    stbtt__handle_clipped_edge
                              ((float *)scanline,(int)fVar120,psVar65,fVar99,fVar98,fVar113,fVar112)
                    ;
                    fVar99 = fVar113;
                    fVar116 = (float)uStack_490;
LAB_00156c63:
                    stbtt__handle_clipped_edge
                              ((float *)scanline,(int)fVar120,psVar65,fVar99,fVar112,fVar109,fVar116
                              );
                    auVar111 = auStack_3a8;
                    fVar113 = fVar109;
                    fVar112 = (float)uStack_490;
                  }
LAB_00156d17:
                  stbtt__handle_clipped_edge
                            ((float *)scanline,(int)fVar120,psVar65,fVar113,fVar112,auVar111._0_4_,
                             fVar75);
                  fVar119 = (float)auStack_3a8._0_4_;
                  uVar104 = auStack_3a8._8_4_;
                  uVar105 = auStack_3a8._12_4_;
                  fVar120 = (float)((int)fVar120 + 1U);
                }
              }
              else {
                if (fVar112 <= fVar98) {
                  fVar112 = fVar98;
                }
                uVar93 = (uint)fVar116;
                if (fVar75 <= fVar120) {
                  fVar120 = fVar75;
                }
                uVar53 = (uint)fVar109;
                if (uVar93 == uVar53) {
                  if (((int)uVar93 < 0) || ((int)uStack_408 < (int)uVar93)) {
                    __assert_fail("x >= 0 && x < len",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imstb_truetype.h"
                                  ,0xbd4,
                                  "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                 );
                  }
                  uVar94 = (ulong)uVar93;
                  *(float *)((long)&scanline->data + uVar94 * 4) =
                       (((fVar109 - (float)(int)uVar93) + (fVar116 - (float)(int)uVar93)) * -0.5 +
                       1.0) * psVar65->direction * (fVar120 - fVar112) +
                       *(float *)((long)&scanline->data + uVar94 * 4);
                  fVar99 = (fVar120 - fVar112) * psVar65->direction;
                }
                else {
                  fVar113 = psVar65->fdy;
                  uVar69 = uVar93;
                  fVar115 = fVar116;
                  if (fVar109 < fVar116) {
                    fVar115 = fVar98 - fVar112;
                    fVar112 = (fVar98 - fVar120) + fVar75;
                    fVar113 = -fVar113;
                    fVar99 = fVar119;
                    uVar69 = uVar53;
                    uVar53 = uVar93;
                    fVar120 = fVar115 + fVar75;
                    fVar115 = fVar109;
                    fVar109 = fVar116;
                  }
                  iVar51 = uVar69 + 1;
                  fVar119 = ((float)iVar51 - fVar99) * fVar113 + fVar98;
                  fVar99 = psVar65->direction;
                  fVar116 = (fVar119 - fVar112) * fVar99;
                  *(float *)((long)&scanline->data + (long)(int)uVar69 * 4) =
                       (1.0 - ((fVar115 - (float)(int)uVar69) + 1.0) * 0.5) * fVar116 +
                       *(float *)((long)&scanline->data + (long)(int)uVar69 * 4);
                  uVar94 = (ulong)(int)uVar53;
                  for (lVar95 = (long)iVar51; lVar95 < (long)uVar94; lVar95 = lVar95 + 1) {
                    *(float *)((long)&scanline->data + lVar95 * 4) =
                         fVar113 * fVar99 * 0.5 + fVar116 +
                         *(float *)((long)&scanline->data + lVar95 * 4);
                    fVar116 = fVar116 + fVar113 * fVar99;
                  }
                  if (1.01 < ABS(fVar116)) {
                    __assert_fail("fabsf(area) <= 1.01f",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imstb_truetype.h"
                                  ,0xbfb,
                                  "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                 );
                  }
                  *(float *)((long)&scanline->data + uVar94 * 4) =
                       (fVar120 - (fVar113 * (float)(int)(uVar53 - iVar51) + fVar119)) *
                       (((fVar109 - (float)(int)uVar53) + 0.0) * -0.5 + 1.0) * fVar99 + fVar116 +
                       *(float *)((long)&scanline->data + uVar94 * 4);
                  fVar99 = (fVar120 - fVar112) * fVar99;
                }
                pfStack_400[uVar94 + 1] = fVar99 + pfStack_400[uVar94 + 1];
              }
            }
            else if (fVar99 < fStack_40c) {
              if (0.0 <= fVar99) {
                auStack_318 = auVar118;
                stbtt__handle_clipped_edge
                          ((float *)scanline,(int)fVar99,psVar65,fVar99,fVar98,fVar99,fVar75);
                iVar51 = (int)fVar99 + 1;
                auVar110 = auStack_318;
              }
              else {
                iVar51 = 0;
                auVar110._8_8_ = 0;
                auVar110._0_8_ = auVar118._0_8_;
              }
              stbtt__handle_clipped_edge
                        (pfStack_400,iVar51,psVar65,auVar110._0_4_,fVar98,auVar110._0_4_,fVar75);
            }
            ptr_00 = psStack_420;
          }
        }
        fVar98 = 0.0;
        uVar94 = uStack_2b8 & 0xffffffff;
        lVar95 = lStack_2e0;
        psVar72 = scanline;
        while (bVar43 = lVar95 != 0, lVar95 = lVar95 + -1, bVar43) {
          fVar98 = fVar98 + *(float *)((long)&psVar72->data + lStack_2d8 * 4);
          iVar51 = (int)(ABS(*(float *)&psVar72->data + fVar98) * 255.0 + 0.5);
          if (0xfe < iVar51) {
            iVar51 = 0xff;
          }
          puStack_380[(int)uVar94] = (uchar)iVar51;
          uVar94 = (ulong)((int)uVar94 + 1);
          psVar72 = (stbtt__buf *)((long)&psVar72->data + 4);
        }
        plVar66 = (long *)auStack_488;
        while (plVar66 = (long *)*plVar66, plVar66 != (long *)0x0) {
          *(float *)(plVar66 + 1) = *(float *)((long)plVar66 + 0xc) + *(float *)(plVar66 + 1);
        }
        uVar89 = (ulong)(iStack_368 + 1);
        uVar94 = (ulong)(uint)((int)uStack_2b8 + iStack_498);
        iVar51 = iStack_3f4 + 1;
      }
      while (puVar64 != (undefined8 *)0x0) {
        puVar16 = (undefined8 *)*puVar64;
        ImGui::MemFree(puVar64);
        puVar64 = puVar16;
      }
      if (scanline != asStack_238) {
        ImGui::MemFree(scanline);
      }
      ImGui::MemFree(psStack_428);
    }
    ImGui::MemFree(pvStack_450);
    ImGui::MemFree(ptr_00);
  }
LAB_0015706f:
  ImGui::MemFree((void *)CONCAT44(uStack_418._4_4_,(stbtt_uint32)uStack_418));
  uVar93._0_2_ = psStack_3c8->x;
  uVar93._2_2_ = psStack_3c8->y;
  uVar53._0_2_ = psStack_3c8->w;
  uVar53._2_2_ = psStack_3c8->h;
  if (1 < (byte)uStack_320) {
    lVar95 = (long)(int)((uVar93 >> 0x10) * iStack_498);
    puVar62 = puStack_398 + lVar95 + (ulong)(ushort)(undefined2)uVar93;
    iVar51 = (uVar53 & 0xffff) - uVar82;
    asStack_238[0].data._0_4_ = 0;
    asStack_238[0].data._4_4_ = 0;
    if (iVar51 < 0) {
      iVar51 = -1;
    }
    uVar94 = (long)iVar51 + 1;
    puVar96 = puStack_2f0 + lVar95 + (ulong)(ushort)(undefined2)uVar93 + (long)iVar51;
    for (uVar93 = 0; uVar89 = uStack_320, uVar93 != uVar53 >> 0x10; uVar93 = uVar93 + 1) {
      memset(asStack_238,0,uStack_320);
      puVar88 = puVar96;
      uVar70 = uVar94;
      switch((int)uVar89) {
      case 2:
        uVar89 = 0;
        for (uVar87 = 0; uVar94 != uVar87; uVar87 = uVar87 + 1) {
          bVar10 = puVar62[uVar87];
          bVar11 = *(byte *)((long)&asStack_238[0].data + (ulong)((uint)uVar87 & 7));
          *(byte *)((long)&asStack_238[0].data + (ulong)((uint)uVar87 + 2 & 7)) = bVar10;
          uVar69 = (int)uVar89 + ((uint)bVar10 - (uint)bVar11);
          uVar89 = (ulong)uVar69;
          puVar62[uVar87] = (uchar)(uVar69 >> 1);
        }
        break;
      case 3:
        uVar89 = 0;
        for (uVar87 = 0; uVar94 != uVar87; uVar87 = uVar87 + 1) {
          bVar10 = puVar62[uVar87];
          bVar11 = *(byte *)((long)&asStack_238[0].data + (ulong)((uint)uVar87 & 7));
          *(byte *)((long)&asStack_238[0].data + (ulong)((uint)uVar87 + 3 & 7)) = bVar10;
          uVar89 = (ulong)((int)uVar89 + ((uint)bVar10 - (uint)bVar11));
          puVar62[uVar87] = (uchar)(uVar89 / 3);
        }
        break;
      case 4:
        uVar89 = 0;
        for (uVar87 = 0; uVar94 != uVar87; uVar87 = uVar87 + 1) {
          bVar10 = puVar62[uVar87];
          uVar86 = (ulong)((uint)uVar87 & 7);
          bVar11 = *(byte *)((long)&asStack_238[0].data + uVar86);
          *(byte *)((long)&asStack_238[0].data + (uVar86 ^ 4)) = bVar10;
          uVar69 = (int)uVar89 + ((uint)bVar10 - (uint)bVar11);
          uVar89 = (ulong)uVar69;
          puVar62[uVar87] = (uchar)(uVar69 >> 2);
        }
        break;
      case 5:
        uVar89 = 0;
        for (uVar87 = 0; uVar94 != uVar87; uVar87 = uVar87 + 1) {
          bVar10 = puVar62[uVar87];
          bVar11 = *(byte *)((long)&asStack_238[0].data + (ulong)((uint)uVar87 & 7));
          *(byte *)((long)&asStack_238[0].data + (ulong)((uint)uVar87 + 5 & 7)) = bVar10;
          uVar89 = (ulong)((int)uVar89 + ((uint)bVar10 - (uint)bVar11));
          puVar62[uVar87] = (uchar)(uVar89 / 5);
        }
        break;
      default:
        uVar89 = 0;
        for (uVar87 = 0; uVar94 != uVar87; uVar87 = uVar87 + 1) {
          bVar10 = puVar62[uVar87];
          bVar11 = *(byte *)((long)&asStack_238[0].data + (ulong)((uint)uVar87 & 7));
          *(byte *)((long)&asStack_238[0].data + (ulong)(uVar82 + (uint)uVar87 & 7)) = bVar10;
          uVar69 = (int)uVar89 + ((uint)bVar10 - (uint)bVar11);
          uVar89 = (ulong)uVar69;
          puVar62[uVar87] = (uchar)(uVar69 / uVar82);
        }
      }
      for (; uVar70 < (uVar53 & 0xffff); uVar70 = uVar70 + 1) {
        if (*puVar88 != '\0') {
          __assert_fail("pixels[i] == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imstb_truetype.h"
                        ,0xf41,
                        "void stbtt__h_prefilter(unsigned char *, int, int, int, unsigned int)");
        }
        uVar69 = (int)uVar89 -
                 (uint)*(byte *)((long)&asStack_238[0].data + (ulong)((uint)uVar70 & 7));
        uVar89 = (ulong)uVar69;
        *puVar88 = (uchar)(uVar69 / uVar82);
        puVar88 = puVar88 + 1;
      }
      puVar62 = puVar62 + lVar57;
      puVar96 = puVar96 + lVar57;
    }
    uVar93._0_2_ = psStack_3c8->x;
    uVar93._2_2_ = psStack_3c8->y;
    uVar53._0_2_ = psStack_3c8->w;
    uVar53._2_2_ = psStack_3c8->h;
  }
  if (1 < (byte)uStack_328) {
    lVar95 = (long)(int)((uVar93 >> 0x10) * iStack_498);
    pbVar79 = puStack_398 + lVar95 + (ulong)(ushort)uVar93;
    uVar67 = (ushort)(uVar53 >> 0x10);
    asStack_238[0].data._0_4_ = 0;
    asStack_238[0].data._4_4_ = 0;
    iVar51 = (uint)uVar67 - auStack_448._0_4_;
    if (iVar51 < 0) {
      iVar51 = -1;
    }
    uVar94 = (long)iVar51 + 1;
    puVar62 = puStack_398 + lVar57 * uVar94 + lVar95 + (ulong)(ushort)uVar93;
    for (uVar93 = 0; uVar89 = uStack_328, uVar93 != (uVar53 & 0xffff); uVar93 = uVar93 + 1) {
      memset(asStack_238,0,uStack_328);
      puVar96 = puVar62;
      uVar70 = uVar94;
      switch((int)uVar89) {
      case 2:
        uVar89 = 0;
        pbVar90 = pbVar79;
        for (uVar87 = 0; uVar94 != uVar87; uVar87 = uVar87 + 1) {
          bVar10 = *pbVar90;
          bVar11 = *(byte *)((long)&asStack_238[0].data + (ulong)((uint)uVar87 & 7));
          *(byte *)((long)&asStack_238[0].data + (ulong)((uint)uVar87 + 2 & 7)) = bVar10;
          uVar69 = (int)uVar89 + ((uint)bVar10 - (uint)bVar11);
          uVar89 = (ulong)uVar69;
          *pbVar90 = (byte)(uVar69 >> 1);
          pbVar90 = pbVar90 + lVar57;
        }
        break;
      case 3:
        uVar89 = 0;
        pbVar90 = pbVar79;
        for (uVar87 = 0; uVar94 != uVar87; uVar87 = uVar87 + 1) {
          bVar10 = *pbVar90;
          bVar11 = *(byte *)((long)&asStack_238[0].data + (ulong)((uint)uVar87 & 7));
          *(byte *)((long)&asStack_238[0].data + (ulong)((uint)uVar87 + 3 & 7)) = bVar10;
          uVar89 = (ulong)((int)uVar89 + ((uint)bVar10 - (uint)bVar11));
          *pbVar90 = (byte)(uVar89 / 3);
          pbVar90 = pbVar90 + lVar57;
        }
        break;
      case 4:
        uVar89 = 0;
        pbVar90 = pbVar79;
        for (uVar87 = 0; uVar94 != uVar87; uVar87 = uVar87 + 1) {
          bVar10 = *pbVar90;
          uVar86 = (ulong)((uint)uVar87 & 7);
          bVar11 = *(byte *)((long)&asStack_238[0].data + uVar86);
          *(byte *)((long)&asStack_238[0].data + (uVar86 ^ 4)) = bVar10;
          uVar69 = (int)uVar89 + ((uint)bVar10 - (uint)bVar11);
          uVar89 = (ulong)uVar69;
          *pbVar90 = (byte)(uVar69 >> 2);
          pbVar90 = pbVar90 + lVar57;
        }
        break;
      case 5:
        uVar89 = 0;
        pbVar90 = pbVar79;
        for (uVar87 = 0; uVar94 != uVar87; uVar87 = uVar87 + 1) {
          bVar10 = *pbVar90;
          bVar11 = *(byte *)((long)&asStack_238[0].data + (ulong)((uint)uVar87 & 7));
          *(byte *)((long)&asStack_238[0].data + (ulong)((uint)uVar87 + 5 & 7)) = bVar10;
          uVar89 = (ulong)((int)uVar89 + ((uint)bVar10 - (uint)bVar11));
          *pbVar90 = (byte)(uVar89 / 5);
          pbVar90 = pbVar90 + lVar57;
        }
        break;
      default:
        uVar89 = 0;
        pbVar90 = pbVar79;
        for (uVar87 = 0; uVar94 != uVar87; uVar87 = uVar87 + 1) {
          bVar10 = *pbVar90;
          bVar11 = *(byte *)((long)&asStack_238[0].data + (ulong)((uint)uVar87 & 7));
          *(byte *)((long)&asStack_238[0].data + (ulong)(auStack_448._0_4_ + (uint)uVar87 & 7)) =
               bVar10;
          uVar89 = (ulong)((int)uVar89 + ((uint)bVar10 - (uint)bVar11));
          *pbVar90 = (byte)(uVar89 / (auStack_448._0_8_ & 0xffffffff));
          pbVar90 = pbVar90 + lVar57;
        }
      }
      for (; uVar70 < uVar67; uVar70 = uVar70 + 1) {
        if (*puVar96 != '\0') {
          __assert_fail("pixels[i*stride_in_bytes] == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imstb_truetype.h"
                        ,0xf7f,
                        "void stbtt__v_prefilter(unsigned char *, int, int, int, unsigned int)");
        }
        uVar69 = (int)uVar89 -
                 (uint)*(byte *)((long)&asStack_238[0].data + (ulong)((uint)uVar70 & 7));
        uVar89 = (ulong)uVar69;
        *puVar96 = (uchar)(uVar69 / auStack_448._0_4_);
        puVar96 = puVar96 + lVar57;
      }
      pbVar79 = pbVar79 + 1;
      puVar62 = puVar62 + 1;
    }
    uVar93._0_2_ = psStack_3c8->x;
    uVar93._2_2_ = psStack_3c8->y;
    uVar53._0_2_ = psStack_3c8->w;
    uVar53._2_2_ = psStack_3c8->h;
  }
  psStack_2c0->x0 = (short)uVar93;
  psStack_2c0->y0 = (short)(uVar93 >> 0x10);
  uVar67 = (ushort)(uVar53 >> 0x10);
  psStack_2c0->x1 = (short)uVar93 + (short)uVar53;
  psStack_2c0->y1 = (short)(uVar93 >> 0x10) + uVar67;
  psStack_2c0->xadvance =
       (float)(int)(short)((short)(uStack_36c << 8) + (short)uStack_370) * fStack_248;
  psStack_2c0->xoff = (float)iStack_358 * auStack_268._0_4_ + auStack_258._0_4_;
  psStack_2c0->yoff = (float)iStack_35c * auStack_268._4_4_ + auStack_258._4_4_;
  psStack_2c0->xoff2 =
       (float)(int)((uVar53 & 0xffff) + iStack_358) * auStack_268._0_4_ + auStack_258._0_4_;
  psStack_2c0->yoff2 =
       (float)(int)((uint)uVar67 + iStack_35c) * auStack_268._4_4_ + auStack_258._4_4_;
  lVar73 = lStack_340;
  lVar95 = lStack_338;
  pIVar80 = (ImVector<ImFontConfig> *)auStack_488._8_8_;
  psVar59 = psStack_2e8;
  pIVar92 = pIStack_478;
  pIVar54 = pIStack_390;
  auVar114 = auStack_258;
LAB_001575f9:
  lVar95 = lVar95 + 1;
  lVar73 = lVar73 + 1;
  goto LAB_00156033;
}

Assistant:

bool    ImFontAtlas::Build()
{
    IM_ASSERT(!Locked && "Cannot modify a locked ImFontAtlas between NewFrame() and EndFrame/Render()!");

    // Select builder
    // - Note that we do not reassign to atlas->FontBuilderIO, since it is likely to point to static data which
    //   may mess with some hot-reloading schemes. If you need to assign to this (for dynamic selection) AND are
    //   using a hot-reloading scheme that messes up static data, store your own instance of ImFontBuilderIO somewhere
    //   and point to it instead of pointing directly to return value of the GetBuilderXXX functions.
    const ImFontBuilderIO* builder_io = FontBuilderIO;
    if (builder_io == NULL)
    {
#ifdef IMGUI_ENABLE_FREETYPE
        builder_io = ImGuiFreeType::GetBuilderForFreeType();
#elif defined(IMGUI_ENABLE_STB_TRUETYPE)
        builder_io = ImFontAtlasGetBuilderForStbTruetype();
#else
        IM_ASSERT(0); // Invalid Build function
#endif
    }

    // Build
    return builder_io->FontBuilder_Build(this);
}